

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cpp
# Opt level: O3

void __thiscall StackTrace::set_read_write(StackTrace *this,size_t addr,size_t pc)

{
  __int_type_conflict _Var1;
  vertex_descriptor vVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int spin_count;
  uint uVar5;
  iterator iVar6;
  ulong local_68;
  _Head_base<0UL,_unsigned_long_&&,_false> local_60;
  _Head_base<0UL,_std::pair<unsigned_long,_unsigned_long>_&&,_false> local_58;
  ulong local_50;
  pair<unsigned_long,_unsigned_long> local_48;
  pair<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>::iterator,_bool>
  local_38;
  
  uVar5 = 0;
  local_68 = addr;
  do {
    if (((this->lock)._locked._M_base._M_i & 1U) == 0) {
      LOCK();
      _Var1 = (this->lock)._locked._M_base._M_i;
      (this->lock)._locked._M_base._M_i = true;
      UNLOCK();
      if ((_Var1 & 1U) == 0) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_68;
        iVar6 = phmap::container_internal::
                raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                ::find<unsigned_long>
                          ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                            *)this,&local_68,
                           SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar4,8) +
                           SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar4,0));
        if (iVar6.ctrl_ ==
            (this->_read_write).
            super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
            .
            super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
            .ctrl_ + (this->_read_write).
                     super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                     .
                     super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                     .capacity_) {
          local_48.second = this->_ce;
          local_58._M_head_impl = &local_48;
          local_50 = local_68;
          local_60._M_head_impl = &local_50;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_68;
          local_48.first = pc;
          phmap::container_internal::
          raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,std::pair<unsigned_long,unsigned_long>>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
          ::
          emplace_decomposable<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long&&>,std::tuple<std::pair<unsigned_long,unsigned_long>&&>>
                    (&local_38,
                     (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,std::pair<unsigned_long,unsigned_long>>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
                      *)this,local_60._M_head_impl,
                     SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),8) +
                     SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),0),
                     (piecewise_construct_t *)&std::piecewise_construct,
                     (tuple<unsigned_long_&&> *)&local_60,
                     (tuple<std::pair<unsigned_long,_unsigned_long>_&&> *)&local_58);
        }
        else {
          vVar2 = this->_ce;
          *(size_t *)((long)iVar6.field_1.slot_ + 8) = pc;
          *(vertex_descriptor *)((long)iVar6.field_1.slot_ + 0x10) = vVar2;
        }
        (this->lock)._locked._M_base._M_i = false;
        return;
      }
    }
    if (0xf < uVar5) {
      sched_yield();
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void StackTrace::set_read_write(size_t addr, size_t pc) {
  std::lock_guard<ipc::spinlock> lg(lock);
  auto it = _read_write.find(addr);
  if (it == _read_write.end()) {
    _read_write.insert({addr, {pc, _ce}});
  } else {
    it->second = {pc, _ce};
  }
}